

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_synth.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double __x;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  pointer pdVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  double *pdVar12;
  _func_int **pp_Var13;
  long lVar14;
  istream *input_stream;
  int iVar15;
  int iVar16;
  char *pcVar17;
  double dVar18;
  allocator local_4ad;
  int fft_length;
  double local_4a8;
  undefined8 local_4a0;
  int frame_shift;
  ulong local_490;
  vector<double,_std::allocator<double>_> f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  int tmp;
  bool local_408;
  double sampling_rate;
  vector<double,_std::allocator<double>_> waveform;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  spectrum;
  WorldSynthesis world_synthesis;
  ostringstream error_message;
  uint auStack_218 [122];
  
  fft_length = 0x400;
  frame_shift = 0x50;
  sampling_rate = 16.0;
  local_490 = local_490 & 0xffffffff00000000;
  local_4a8 = (double)((ulong)local_4a8 & 0xffffffff00000000);
  iVar16 = 0;
LAB_00103687:
  while (iVar10 = ya_getopt_long(argc,argv,"l:p:s:F:S:A:h",(option *)0x0,(int *)0x0), iVar10 == 0x6c
        ) {
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&world_synthesis);
    bVar9 = sptk::ConvertStringToInteger((string *)&error_message,&fft_length);
    bVar7 = fft_length < 0x200;
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar9 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "The argument for the -l option must be at least 512");
      std::__cxx11::string::string((string *)&world_synthesis,"world_synth",(allocator *)&tmp);
      sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
LAB_00103c7a:
      std::__cxx11::string::~string((string *)&world_synthesis);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      return 1;
    }
  }
  if (iVar10 == 0x70) {
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&world_synthesis);
    bVar9 = sptk::ConvertStringToInteger((string *)&error_message,&frame_shift);
    bVar7 = frame_shift < 1;
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar9 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "The argument for the -p option must be a positive integer");
      std::__cxx11::string::string((string *)&world_synthesis,"world_synth",(allocator *)&tmp);
      sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
      goto LAB_00103c7a;
    }
    goto LAB_00103687;
  }
  if (iVar10 == 0x73) {
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&world_synthesis);
    bVar7 = sptk::ConvertStringToDouble((string *)&error_message,&sampling_rate);
    if (bVar7) {
      bVar7 = sptk::IsInRange(sampling_rate,8.0,98.0);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar7) goto LAB_00103687;
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar11 = std::operator<<((ostream *)&error_message,
                              "The argument for the -s option must be in a number ");
    std::operator<<(poVar11,"in the interval [");
    poVar11 = std::ostream::_M_insert<double>(8.0);
    std::operator<<(poVar11,", ");
    poVar11 = std::ostream::_M_insert<double>(98.0);
    std::operator<<(poVar11,"]");
    std::__cxx11::string::string((string *)&world_synthesis,"world_synth",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
    goto LAB_00103c7a;
  }
  if (iVar10 != -1) {
    if (iVar10 != 0x41) {
      if (iVar10 != 0x46) {
        if (iVar10 != 0x53) {
          if (iVar10 == 0x68) {
            anon_unknown.dwarf_41f8::PrintUsage((ostream *)&std::cout);
            return 0;
          }
          anon_unknown.dwarf_41f8::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,ya_optarg,(allocator *)&world_synthesis);
        bVar7 = sptk::ConvertStringToInteger((string *)&error_message,&tmp);
        if (bVar7) {
          bVar7 = sptk::IsInRange(tmp,0,3);
          std::__cxx11::string::~string((string *)&error_message);
          if (bVar7) {
            local_490 = CONCAT44(local_490._4_4_,tmp);
            goto LAB_00103687;
          }
        }
        else {
          std::__cxx11::string::~string((string *)&error_message);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        poVar11 = std::operator<<((ostream *)&error_message,
                                  "The argument for the -S option must be an integer ");
        poVar11 = std::operator<<(poVar11,"in the range of ");
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0);
        poVar11 = std::operator<<(poVar11," to ");
        std::ostream::operator<<((ostream *)poVar11,3);
        std::__cxx11::string::string
                  ((string *)&world_synthesis,"world_synth",(allocator *)&aperiodicity);
        sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
        goto LAB_00103c7a;
      }
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&world_synthesis)
      ;
      bVar7 = sptk::ConvertStringToInteger((string *)&error_message,&tmp);
      if (bVar7) {
        bVar7 = sptk::IsInRange(tmp,0,2);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar7) {
          local_4a8 = (double)CONCAT44(local_4a8._4_4_,tmp);
          goto LAB_00103687;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&error_message);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      poVar11 = std::operator<<((ostream *)&error_message,
                                "The argument for the -F option must be an integer ");
      poVar11 = std::operator<<(poVar11,"in the range of ");
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0);
      poVar11 = std::operator<<(poVar11," to ");
      std::ostream::operator<<((ostream *)poVar11,2);
      std::__cxx11::string::string
                ((string *)&world_synthesis,"world_synth",(allocator *)&aperiodicity);
      sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
      goto LAB_00103c7a;
    }
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&world_synthesis);
    bVar7 = sptk::ConvertStringToInteger((string *)&error_message,&tmp);
    if (bVar7) {
      bVar7 = sptk::IsInRange(tmp,0,3);
      std::__cxx11::string::~string((string *)&error_message);
      iVar16 = tmp;
      if (bVar7) goto LAB_00103687;
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar11 = std::operator<<((ostream *)&error_message,
                              "The argument for the -A option must be an integer ");
    poVar11 = std::operator<<(poVar11,"in the range of ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0);
    poVar11 = std::operator<<(poVar11," to ");
    std::ostream::operator<<((ostream *)poVar11,3);
    std::__cxx11::string::string
              ((string *)&world_synthesis,"world_synth",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
    goto LAB_00103c7a;
  }
  lVar14 = (long)argc;
  iVar10 = local_4a8._0_4_;
  if (argc - ya_optind == 2) {
    lVar4 = lVar14 + -2;
    lVar5 = lVar14 + -1;
    pcVar17 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "Just three input files, spfile, apfile, and f0file are required");
      std::__cxx11::string::string((string *)&world_synthesis,"world_synth",(allocator *)&tmp);
      sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
      goto LAB_00103c7a;
    }
    lVar4 = lVar14 + -3;
    lVar5 = lVar14 + -2;
    pcVar17 = argv[lVar14 + -1];
  }
  pcVar2 = argv[lVar4];
  pcVar3 = argv[lVar5];
  bVar7 = sptk::SetBinaryMode();
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&world_synthesis,"world_synth",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
    goto LAB_00103c7a;
  }
  iVar15 = fft_length / 2;
  local_4a8 = sampling_rate;
  f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input_stream = (istream *)&error_message;
  std::ifstream::ifstream(input_stream);
  local_4a8 = local_4a8 * 1000.0;
  if ((pcVar17 == (char *)0x0) ||
     (std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar17),
     (*(byte *)((long)auStack_218 + *(long *)(_error_message + -0x18)) & 5) == 0)) {
    cVar8 = std::__basic_file<char>::is_open();
    if (cVar8 == '\0') {
      input_stream = (istream *)&std::cin;
    }
    while (bVar7 = sptk::ReadStream<double>((double *)&world_synthesis,input_stream),
          pdVar6 = f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish, bVar7) {
      std::vector<double,_std::allocator<double>_>::push_back
                (&f0,(value_type_conflict *)&world_synthesis);
    }
    pdVar12 = f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (iVar10 == 2) {
      for (; pdVar12 != pdVar6; pdVar12 = pdVar12 + 1) {
        __x = *pdVar12;
        dVar18 = 0.0;
        if ((__x != -10000000000.0) || (NAN(__x))) {
          dVar18 = exp(__x);
        }
        *pdVar12 = dVar18;
      }
    }
    else if (iVar10 == 0) {
      for (; pdVar12 !=
             f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish; pdVar12 = pdVar12 + 1) {
        *pdVar12 = (double)(~-(ulong)(*pdVar12 == 0.0) & (ulong)(local_4a8 / *pdVar12));
      }
    }
    local_4a0 = 0;
    bVar7 = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&world_synthesis);
    poVar11 = std::operator<<((ostream *)&world_synthesis,"Cannot open file ");
    std::operator<<(poVar11,pcVar17);
    std::__cxx11::string::string((string *)&tmp,"world_synth",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&world_synthesis);
    std::__cxx11::string::~string((string *)&tmp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&world_synthesis);
    local_4a0 = 1;
    bVar7 = false;
  }
  std::ifstream::~ifstream(&error_message);
  if (!bVar7) {
    iVar16 = (int)local_4a0;
    goto LAB_00104600;
  }
  if (f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar16 = 0;
    goto LAB_00104600;
  }
  spectrum.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spectrum.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spectrum.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::reserve(&spectrum,
            (long)f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            ((SpectrumToSpectrum *)&tmp,fft_length,(InputOutputFormats)local_490,kPowerSpectrum,0.0,
             -1.79769313486232e+308);
  iVar15 = iVar15 + 1;
  local_490 = (ulong)iVar15;
  if (local_408 == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"FFT length must be a power of 2");
    std::__cxx11::string::string
              ((string *)&world_synthesis,"world_synth",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&world_synthesis,&error_message);
    std::__cxx11::string::~string((string *)&world_synthesis);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    local_4a0 = 1;
    bVar7 = false;
  }
  else {
    std::ifstream::ifstream(&error_message);
    std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar2);
    if ((*(byte *)((long)auStack_218 + *(long *)(_error_message + -0x18)) & 5) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&waveform,local_490,(allocator_type *)&world_synthesis);
      while (bVar7 = sptk::ReadStream<double>
                               (false,0,0,iVar15,&waveform,(istream *)&error_message,(int *)0x0),
            bVar7) {
        bVar9 = sptk::SpectrumToSpectrum::Run((SpectrumToSpectrum *)&tmp,&waveform);
        if (!bVar9) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&world_synthesis);
          std::operator<<((ostream *)&world_synthesis,"Failed to convert spectrum");
          std::__cxx11::string::string((string *)&aperiodicity,"world_synth",&local_4ad);
          sptk::PrintErrorMessage((string *)&aperiodicity,(ostringstream *)&world_synthesis);
          std::__cxx11::string::~string((string *)&aperiodicity);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&world_synthesis);
          local_4a0 = 1;
          break;
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&spectrum,&waveform);
      }
      bVar7 = !bVar7;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&waveform.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&world_synthesis);
      poVar11 = std::operator<<((ostream *)&world_synthesis,"Cannot open file ");
      std::operator<<(poVar11,pcVar2);
      std::__cxx11::string::string((string *)&aperiodicity,"world_synth",(allocator *)&waveform);
      sptk::PrintErrorMessage((string *)&aperiodicity,(ostringstream *)&world_synthesis);
      std::__cxx11::string::~string((string *)&aperiodicity);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&world_synthesis);
      local_4a0 = 1;
      bVar7 = false;
    }
    std::ifstream::~ifstream(&error_message);
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum((SpectrumToSpectrum *)&tmp);
  if (bVar7) {
    aperiodicity.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    aperiodicity.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    aperiodicity.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::reserve(&aperiodicity,
              (long)f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
    std::ifstream::ifstream(&error_message);
    std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar3);
    uVar1 = *(uint *)((long)auStack_218 + *(long *)(_error_message + -0x18));
    if ((uVar1 & 5) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&world_synthesis,local_490,
                 (allocator_type *)&tmp);
      while (bVar7 = sptk::ReadStream<double>
                               (false,0,0,iVar15,
                                (vector<double,_std::allocator<double>_> *)&world_synthesis,
                                (istream *)&error_message,(int *)0x0), bVar7) {
        pp_Var13 = world_synthesis._vptr_WorldSynthesis;
        if (iVar16 == 1) {
          for (; pp_Var13 != (_func_int **)world_synthesis._8_8_; pp_Var13 = pp_Var13 + 1) {
            *pp_Var13 = (_func_int *)(1.0 - (double)*pp_Var13);
          }
        }
        else if (iVar16 == 2) {
          for (; pp_Var13 != (_func_int **)world_synthesis._8_8_; pp_Var13 = pp_Var13 + 1) {
            *pp_Var13 = (_func_int *)((double)*pp_Var13 / ((double)*pp_Var13 + 1.0));
          }
        }
        else if (iVar16 == 3) {
          for (; pp_Var13 != (_func_int **)world_synthesis._8_8_; pp_Var13 = pp_Var13 + 1) {
            *pp_Var13 = (_func_int *)(1.0 / ((double)*pp_Var13 + 1.0));
          }
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&aperiodicity,(value_type *)&world_synthesis);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&world_synthesis);
      iVar16 = (int)local_4a0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&world_synthesis);
      poVar11 = std::operator<<((ostream *)&world_synthesis,"Cannot open file ");
      std::operator<<(poVar11,pcVar3);
      std::__cxx11::string::string((string *)&tmp,"world_synth",(allocator *)&waveform);
      sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&world_synthesis);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&world_synthesis);
      iVar16 = 1;
    }
    std::ifstream::~ifstream(&error_message);
    if ((uVar1 & 5) == 0) {
      sptk::WorldSynthesis::WorldSynthesis(&world_synthesis,fft_length,frame_shift,local_4a8);
      if (world_synthesis.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"Failed to initialize WorldSynthesis");
        std::__cxx11::string::string((string *)&tmp,"world_synth",(allocator *)&waveform);
        sptk::PrintErrorMessage((string *)&tmp,&error_message);
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        iVar16 = 1;
      }
      else {
        waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        bVar7 = sptk::WorldSynthesis::Run(&world_synthesis,&f0,&spectrum,&aperiodicity,&waveform);
        if (bVar7) {
          iVar16 = 0;
          bVar7 = sptk::WriteStream<double>
                            (0,(int)((ulong)((long)waveform.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)waveform.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                             &waveform,(ostream *)&std::cout,(int *)0x0);
          if (!bVar7) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Failed to write waveform");
            std::__cxx11::string::string((string *)&tmp,"world_synth",&local_4ad);
            sptk::PrintErrorMessage((string *)&tmp,&error_message);
            goto LAB_001045c1;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,"Failed to synthesize waveform");
          std::__cxx11::string::string((string *)&tmp,"world_synth",&local_4ad);
          sptk::PrintErrorMessage((string *)&tmp,&error_message);
LAB_001045c1:
          std::__cxx11::string::~string((string *)&tmp);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
          iVar16 = 1;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&waveform.super__Vector_base<double,_std::allocator<double>_>);
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&aperiodicity);
  }
  else {
    iVar16 = (int)local_4a0;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&spectrum);
LAB_00104600:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&f0.super__Vector_base<double,_std::allocator<double>_>);
  return iVar16;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  PitchFormats pitch_format(kDefaultPitchFormat);
  sptk::SpectrumToSpectrum::InputOutputFormats spectrum_format(
      kDefaultSpectrumFormat);
  AperiodicityFormats aperiodicity_format(kDefaultAperiodicityFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:p:s:F:S:A:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length < 512) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be at least 512";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'F': {
        const int min(0);
        const int max(static_cast<int>(kNumPitchFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -F option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        pitch_format = static_cast<PitchFormats>(tmp);
        break;
      }
      case 'S': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        spectrum_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'A': {
        const int min(0);
        const int max(static_cast<int>(kNumAperiodicityFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -A option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        aperiodicity_format = static_cast<AperiodicityFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* spectrum_file;
  const char* aperiodicity_file;
  const char* f0_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    spectrum_file = argv[argc - 3];
    aperiodicity_file = argv[argc - 2];
    f0_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    spectrum_file = argv[argc - 2];
    aperiodicity_file = argv[argc - 1];
    f0_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message
        << "Just three input files, spfile, apfile, and f0file are required";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }
  const int spectrum_size(fft_length / 2 + 1);
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    if (NULL != f0_file) {
      ifs.open(f0_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << f0_file;
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (pitch_format) {
      case kPitch: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [sampling_rate_in_hz](double x) {
                         return (0.0 == x) ? 0.0 : sampling_rate_in_hz / x;
                       });
        break;
      }
      case kF0: {
        // nothing to do
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? 0.0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<std::vector<double>> spectrum;
  spectrum.reserve(f0.size());
  {
    sptk::SpectrumToSpectrum spectrum_to_spectrum(
        fft_length,
        static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(
            spectrum_format),
        sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
    if (!spectrum_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "FFT length must be a power of 2";
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }

    std::ifstream ifs;
    ifs.open(spectrum_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << spectrum_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      if (!spectrum_to_spectrum.Run(&tmp)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
      spectrum.push_back(tmp);
    }
  }

  std::vector<std::vector<double>> aperiodicity;
  aperiodicity.reserve(f0.size());
  {
    std::ifstream ifs;
    ifs.open(aperiodicity_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << aperiodicity_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      switch (aperiodicity_format) {
        case kAperiodicity: {
          // nothing to do
          break;
        }
        case kPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double p) { return 1.0 - p; });
          break;
        }
        case kAperiodicityOverPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double ap) { return ap / (1.0 + ap); });
          break;
        }
        case kPeriodicityOverAperiodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double pa) { return 1.0 / (1.0 + pa); });
          break;
        }
        default: {
          break;
        }
      }
      aperiodicity.push_back(tmp);
    }
  }

  sptk::WorldSynthesis world_synthesis(fft_length, frame_shift,
                                       sampling_rate_in_hz);
  if (!world_synthesis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WorldSynthesis";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  std::vector<double> waveform;
  if (!world_synthesis.Run(f0, spectrum, aperiodicity, &waveform)) {
    std::ostringstream error_message;
    error_message << "Failed to synthesize waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::WriteStream(0, static_cast<int>(waveform.size()), waveform,
                         &std::cout, NULL)) {
    std::ostringstream error_message;
    error_message << "Failed to write waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  return 0;
}